

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dblk_compr.c
# Opt level: O3

void ReadPCMComprTable(UINT32 dataSize,UINT8 *data,PCM_COMPR_TBL *comprTbl)

{
  byte bVar1;
  ushort uVar2;
  UINT8 *__dest;
  uint uVar3;
  uint uVar4;
  
  comprTbl->comprType = *data;
  comprTbl->cmpSubType = data[1];
  bVar1 = data[2];
  comprTbl->bitsDec = bVar1;
  comprTbl->bitsCmp = data[3];
  uVar2 = *(ushort *)(data + 4);
  uVar3 = bVar1 + 7 >> 3;
  uVar4 = uVar2 * uVar3;
  if (dataSize < uVar4 + 6) {
    uVar4 = dataSize - 6;
    uVar2 = (ushort)(uVar4 / uVar3);
  }
  comprTbl->valueCount = uVar2;
  __dest = (UINT8 *)realloc((comprTbl->values).d8,(ulong)uVar4);
  (comprTbl->values).d8 = __dest;
  memcpy(__dest,data + 6,(ulong)uVar4);
  return;
}

Assistant:

void ReadPCMComprTable(UINT32 dataSize, const UINT8* data, PCM_COMPR_TBL* comprTbl)
{
	UINT8 valSize;
	UINT32 tblSize;
	
	comprTbl->comprType = data[0x00];
	comprTbl->cmpSubType = data[0x01];
	comprTbl->bitsDec = data[0x02];
	comprTbl->bitsCmp = data[0x03];
	comprTbl->valueCount = ReadLE16(&data[0x04]);
	
	valSize = (comprTbl->bitsDec + 7) / 8;
	tblSize = comprTbl->valueCount * valSize;
	
	if (dataSize < 0x06 + tblSize)
	{
		//printf("Warning! Bad PCM Table Length!\n");
		tblSize = dataSize - 0x06;
		comprTbl->valueCount = tblSize / valSize;
	}
	
	comprTbl->values.d8 = (UINT8*)realloc(comprTbl->values.d8, tblSize);
	if (valSize < 0x02)
	{
		memcpy(comprTbl->values.d8, &data[0x06], tblSize);
	}
	else
	{
#ifndef VGM_LITTLE_ENDIAN
		UINT16 curVal;
		
		for (curVal = 0x00; curVal < comprTbl->valueCount; curVal ++)
			comprTbl->values.d16[curVal] = ReadLE16(&data[0x06 + curVal * 0x02]);
#else
		memcpy(comprTbl->values.d16, &data[0x06], tblSize);
#endif
	}
	
	return;
}